

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigFilter.cpp
# Opt level: O0

bool __thiscall eglu::FilterList::match(FilterList *this,CandidateConfig *candidate)

{
  bool bVar1;
  reference pp_Var2;
  ConfigFilter filter;
  __normal_iterator<bool_(*const_*)(const_eglu::CandidateConfig_&),_std::vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>_>
  local_28;
  const_iterator filterIter;
  CandidateConfig *candidate_local;
  FilterList *this_local;
  
  filterIter._M_current = (_func_bool_CandidateConfig_ptr **)candidate;
  local_28._M_current =
       (_func_bool_CandidateConfig_ptr **)
       std::
       vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
       ::begin((vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                *)this);
  while( true ) {
    filter = (ConfigFilter)
             std::
             vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
             ::end((vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    *)this);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<bool_(*const_*)(const_eglu::CandidateConfig_&),_std::vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>_>
                        *)&filter);
    if (!bVar1) {
      return true;
    }
    pp_Var2 = __gnu_cxx::
              __normal_iterator<bool_(*const_*)(const_eglu::CandidateConfig_&),_std::vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>_>
              ::operator*(&local_28);
    bVar1 = (**pp_Var2)((CandidateConfig *)filterIter._M_current);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<bool_(*const_*)(const_eglu::CandidateConfig_&),_std::vector<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>_>
    ::operator++(&local_28,0);
  }
  return false;
}

Assistant:

bool FilterList::match (const CandidateConfig& candidate) const
{
	for (vector<ConfigFilter>::const_iterator filterIter = m_rules.begin(); filterIter != m_rules.end(); filterIter++)
	{
		ConfigFilter filter = *filterIter;

		if (!filter(candidate))
			return false;
	}

	return true;
}